

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

char * __thiscall cmMakefile::GetProperty(cmMakefile *this,string *prop)

{
  bool chain_00;
  cmState *this_00;
  char *pcVar1;
  bool chain;
  string *prop_local;
  cmMakefile *this_local;
  
  this_00 = GetState(this);
  chain_00 = cmState::IsPropertyChained(this_00,prop,DIRECTORY);
  pcVar1 = GetProperty(this,prop,chain_00);
  return pcVar1;
}

Assistant:

const char *cmMakefile::GetProperty(const std::string& prop) const
{
  const bool chain = this->GetState()->
                  IsPropertyChained(prop, cmProperty::DIRECTORY);
  return this->GetProperty(prop, chain);
}